

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::SetPropertyValueInfo
          (PathTypeHandlerBase *this,PropertyValueInfo *info,RecyclableObject *instance,
          PropertyIndex index,ObjectSlotAttributes attributes)

{
  PropertyAttributes attributes_00;
  bool bVar1;
  byte bVar2;
  uint16 uVar3;
  TypePath *pTVar4;
  ObjectSlotAttributes attributes_local;
  PropertyIndex index_local;
  RecyclableObject *instance_local;
  PropertyValueInfo *info_local;
  PathTypeHandlerBase *this_local;
  
  attributes_00 = ObjectSlotAttributesToPropertyAttributes(attributes);
  PropertyValueInfo::Set(info,instance,index,attributes_00,InlineCacheNoFlags);
  bVar1 = FixPropsOnPathTypes();
  if (bVar1) {
    pTVar4 = GetTypePath(this);
    bVar2 = TypePath::GetMaxInitializedLength(pTVar4);
    if (index < bVar2) {
      pTVar4 = GetTypePath(this);
      uVar3 = GetPathLength(this);
      bVar1 = TypePath::GetIsFixedFieldAt(pTVar4,index,(uint)uVar3);
      if (!bVar1) {
        return;
      }
    }
    PropertyValueInfo::DisableStoreFieldCache(info);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::SetPropertyValueInfo(PropertyValueInfo* info, RecyclableObject* instance, PropertyIndex index, ObjectSlotAttributes attributes)
    {
        PropertyValueInfo::Set(info, instance, index, ObjectSlotAttributesToPropertyAttributes(attributes));
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        if (FixPropsOnPathTypes() && (index >= this->GetTypePath()->GetMaxInitializedLength() || this->GetTypePath()->GetIsFixedFieldAt(index, GetPathLength())))
        {
            PropertyValueInfo::DisableStoreFieldCache(info);
        }
#endif
    }